

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

void __thiscall
llvm::SourceMgr::PrintMessage
          (SourceMgr *this,raw_ostream *OS,SMDiagnostic *Diagnostic,bool ShowColors)

{
  bool bVar1;
  uint i;
  SMLoc Loc;
  SrcBuffer *pSVar2;
  SMLoc SStack_30;
  uint CurBuf;
  byte local_21;
  SMDiagnostic *pSStack_20;
  bool ShowColors_local;
  SMDiagnostic *Diagnostic_local;
  raw_ostream *OS_local;
  SourceMgr *this_local;
  
  local_21 = ShowColors;
  pSStack_20 = Diagnostic;
  Diagnostic_local = (SMDiagnostic *)OS;
  OS_local = (raw_ostream *)this;
  if (this->DiagHandler == (DiagHandlerTy)0x0) {
    SStack_30 = SMDiagnostic::getLoc(Diagnostic);
    bVar1 = SMLoc::isValid(&stack0xffffffffffffffd0);
    if (bVar1) {
      Loc = SMDiagnostic::getLoc(pSStack_20);
      i = FindBufferContainingLoc(this,Loc);
      if (i == 0) {
        __assert_fail("CurBuf && \"Invalid or unspecified location!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/SourceMgr.cpp"
                      ,0xeb,
                      "void llvm::SourceMgr::PrintMessage(raw_ostream &, const SMDiagnostic &, bool) const"
                     );
      }
      pSVar2 = getBufferInfo(this,i);
      PrintIncludeStack(this,(SMLoc)(pSVar2->IncludeLoc).Ptr,(raw_ostream *)Diagnostic_local);
    }
    SMDiagnostic::print(pSStack_20,(char *)0x0,(raw_ostream *)Diagnostic_local,(bool)(local_21 & 1),
                        true);
  }
  else {
    (*this->DiagHandler)(Diagnostic,this->DiagContext);
  }
  return;
}

Assistant:

void SourceMgr::PrintMessage(raw_ostream &OS, const SMDiagnostic &Diagnostic,
                             bool ShowColors) const {
  // Report the message with the diagnostic handler if present.
  if (DiagHandler) {
    DiagHandler(Diagnostic, DiagContext);
    return;
  }

  if (Diagnostic.getLoc().isValid()) {
    unsigned CurBuf = FindBufferContainingLoc(Diagnostic.getLoc());
    assert(CurBuf && "Invalid or unspecified location!");
    PrintIncludeStack(getBufferInfo(CurBuf).IncludeLoc, OS);
  }

  Diagnostic.print(nullptr, OS, ShowColors);
}